

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

void __thiscall
spirv_cross::CompilerGLSL::emit_hoisted_temporaries
          (CompilerGLSL *this,
          SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>,_8UL>
          *temporaries)

{
  uint id;
  ulong uVar1;
  uint32_t id_00;
  bool bVar2;
  SPIRType *type;
  Bitset *pBVar3;
  iterator iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  long lVar5;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *__i;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar6;
  pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>
  *ppVar7;
  uint32_t mirror_id;
  _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
  *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string initializer;
  string local_70;
  string local_50 [32];
  
  uVar1 = (temporaries->
          super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
          ).buffer_size;
  if (uVar1 != 0) {
    ppVar7 = (temporaries->
             super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
             ).ptr;
    lVar5 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    ::std::
    __introsort_loop<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>*,long,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerGLSL::emit_hoisted_temporaries(spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>&)::__0>>
              (ppVar7,ppVar7 + uVar1,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)uVar1 < 0x11) {
      ::std::
      __insertion_sort<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerGLSL::emit_hoisted_temporaries(spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>&)::__0>>
                (ppVar7,ppVar7 + uVar1);
    }
    else {
      ppVar6 = ppVar7 + 0x10;
      ::std::
      __insertion_sort<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>*,__gnu_cxx::__ops::_Iter_comp_iter<spirv_cross::CompilerGLSL::emit_hoisted_temporaries(spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>&)::__0>>
                (ppVar7,ppVar6);
      for (lVar5 = uVar1 * 8 + -0x80; lVar5 != 0; lVar5 = lVar5 + -8) {
        ::std::
        __unguarded_linear_insert<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>*,__gnu_cxx::__ops::_Val_comp_iter<spirv_cross::CompilerGLSL::emit_hoisted_temporaries(spirv_cross::SmallVector<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,spirv_cross::TypedID<(spirv_cross::Types)0>>,8ul>&)::__0>>
                  (ppVar6);
        ppVar6 = ppVar6 + 1;
      }
    }
  }
  ppVar7 = (temporaries->
           super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
           ).ptr;
  local_d0 = (_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
              *)&(this->super_Compiler).hoisted_temporaries;
  for (lVar5 = (temporaries->
               super_VectorView<std::pair<spirv_cross::TypedID<(spirv_cross::Types)1>,_spirv_cross::TypedID<(spirv_cross::Types)0>_>_>
               ).buffer_size << 3; lVar5 != 0; lVar5 = lVar5 + -8) {
    type = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,(ppVar7->first).id);
    if ((type->pointer != true) || ((this->backend).native_pointers == true)) {
      add_local_variable_name(this,(ppVar7->second).id);
      pBVar3 = Compiler::get_decoration_bitset(&this->super_Compiler,(ID)(ppVar7->second).id);
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &initializer.field_2;
      initializer._M_string_length = 0;
      initializer.field_2._M_local_buf[0] = '\0';
      initializer._M_dataplus._M_p = (pointer)ts_1;
      if ((this->options).force_zero_initialized_variables == true) {
        bVar2 = type_can_zero_initialize(this,type);
        if (bVar2) {
          (*(this->super_Compiler)._vptr_Compiler[0x3b])(&local_c8,this,(ulong)(ppVar7->first).id);
          join<char_const(&)[4],std::__cxx11::string>
                    (&local_70,(spirv_cross *)0x297dc7,(char (*) [4])&local_c8,ts_1);
          ::std::__cxx11::string::operator=((string *)&initializer,(string *)&local_70);
          ::std::__cxx11::string::~string((string *)&local_70);
          ::std::__cxx11::string::~string((string *)&local_c8);
        }
      }
      flags_to_qualifiers_glsl_abi_cxx11_(&local_70,this,type,pBVar3);
      (*(this->super_Compiler)._vptr_Compiler[6])(local_50,this,(ulong)(ppVar7->second).id,1);
      (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_c8,this,type,local_50,0);
      statement<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                (this,&local_70,&local_c8,&initializer,(char (*) [2])0x297c5b);
      ::std::__cxx11::string::~string((string *)&local_c8);
      ::std::__cxx11::string::~string(local_50);
      ::std::__cxx11::string::~string((string *)&local_70);
      local_70._M_dataplus._M_p._0_4_ = (ppVar7->second).id;
      ::std::__detail::
      _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert(local_d0,(value_type *)&local_70);
      local_70._M_dataplus._M_p._0_4_ = (ppVar7->second).id;
      ::std::__detail::
      _Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
      ::insert((_Insert<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>,_true>
                *)&(this->super_Compiler).forced_temporaries,(value_type *)&local_70);
      id = (ppVar7->second).id;
      (*(this->super_Compiler)._vptr_Compiler[6])(&local_70,this,(ulong)id,1);
      local_c8._M_dataplus._M_p._0_1_ = 1;
      Compiler::
      set<spirv_cross::SPIRExpression,std::__cxx11::string,spirv_cross::TypedID<(spirv_cross::Types)1>&,bool>
                (&this->super_Compiler,id,&local_70,&ppVar7->first,(bool *)&local_c8);
      ::std::__cxx11::string::~string((string *)&local_70);
      local_70._M_dataplus._M_p._0_4_ = (ppVar7->second).id;
      iVar4 = ::std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->temporary_to_mirror_precision_alias)._M_h,(key_type *)&local_70);
      if (iVar4.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur
          != (__node_type *)0x0) {
        mirror_id = *(uint32_t *)
                     ((long)iVar4.
                            super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                            ._M_cur + 0xc);
        pBVar3 = Compiler::get_decoration_bitset(&this->super_Compiler,(ID)mirror_id);
        flags_to_qualifiers_glsl_abi_cxx11_(&local_70,this,type,pBVar3);
        (*(this->super_Compiler)._vptr_Compiler[6])(local_50,this,(ulong)mirror_id,1);
        (*(this->super_Compiler)._vptr_Compiler[0x1b])(&local_c8,this,type,local_50,0);
        statement<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string&,char_const(&)[2]>
                  (this,&local_70,&local_c8,&initializer,(char (*) [2])0x297c5b);
        ::std::__cxx11::string::~string((string *)&local_c8);
        ::std::__cxx11::string::~string(local_50);
        ::std::__cxx11::string::~string((string *)&local_70);
        id_00 = mirror_id;
        (*(this->super_Compiler)._vptr_Compiler[6])(&local_70,this,(ulong)mirror_id,1);
        local_c8._M_dataplus._M_p._0_1_ = 1;
        Compiler::
        set<spirv_cross::SPIRExpression,std::__cxx11::string,spirv_cross::TypedID<(spirv_cross::Types)1>&,bool>
                  (&this->super_Compiler,id_00,&local_70,&ppVar7->first,(bool *)&local_c8);
        ::std::__cxx11::string::~string((string *)&local_70);
        ::std::__detail::
        _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                  *)local_d0,&mirror_id);
      }
      ::std::__cxx11::string::~string((string *)&initializer);
    }
    ppVar7 = ppVar7 + 1;
  }
  return;
}

Assistant:

void CompilerGLSL::emit_hoisted_temporaries(SmallVector<pair<TypeID, ID>> &temporaries)
{
	// If we need to force temporaries for certain IDs due to continue blocks, do it before starting loop header.
	// Need to sort these to ensure that reference output is stable.
	sort(begin(temporaries), end(temporaries),
	     [](const pair<TypeID, ID> &a, const pair<TypeID, ID> &b) { return a.second < b.second; });

	for (auto &tmp : temporaries)
	{
		auto &type = get<SPIRType>(tmp.first);

		// There are some rare scenarios where we are asked to declare pointer types as hoisted temporaries.
		// This should be ignored unless we're doing actual variable pointers and backend supports it.
		// Access chains cannot normally be lowered to temporaries in GLSL and HLSL.
		if (type.pointer && !backend.native_pointers)
			continue;

		add_local_variable_name(tmp.second);
		auto &flags = get_decoration_bitset(tmp.second);

		// Not all targets support pointer literals, so don't bother with that case.
		string initializer;
		if (options.force_zero_initialized_variables && type_can_zero_initialize(type))
			initializer = join(" = ", to_zero_initialized_expression(tmp.first));

		statement(flags_to_qualifiers_glsl(type, flags), variable_decl(type, to_name(tmp.second)), initializer, ";");

		hoisted_temporaries.insert(tmp.second);
		forced_temporaries.insert(tmp.second);

		// The temporary might be read from before it's assigned, set up the expression now.
		set<SPIRExpression>(tmp.second, to_name(tmp.second), tmp.first, true);

		// If we have hoisted temporaries in multi-precision contexts, emit that here too ...
		// We will not be able to analyze hoisted-ness for dependent temporaries that we hallucinate here.
		auto mirrored_precision_itr = temporary_to_mirror_precision_alias.find(tmp.second);
		if (mirrored_precision_itr != temporary_to_mirror_precision_alias.end())
		{
			uint32_t mirror_id = mirrored_precision_itr->second;
			auto &mirror_flags = get_decoration_bitset(mirror_id);
			statement(flags_to_qualifiers_glsl(type, mirror_flags),
			          variable_decl(type, to_name(mirror_id)),
			          initializer, ";");
			// The temporary might be read from before it's assigned, set up the expression now.
			set<SPIRExpression>(mirror_id, to_name(mirror_id), tmp.first, true);
			hoisted_temporaries.insert(mirror_id);
		}
	}
}